

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall Table::measureCell(Table *this,string *data,uint *minimum,uint *maximum)

{
  uint uVar1;
  string stripped;
  string sStack_38;
  
  Color::strip(&sStack_38,data);
  uVar1 = longestLine(&sStack_38);
  *maximum = uVar1;
  uVar1 = longestWord(&sStack_38);
  *minimum = uVar1;
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Table::measureCell (
  const std::string& data,
  unsigned int& minimum,
  unsigned int& maximum) const
{
  std::string stripped = Color::strip (data);
  maximum = longestLine (stripped);
  minimum = longestWord (stripped);
}